

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,Identifier *name,int file,int section,size_t referenceIndex)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined4 uStack_64;
  SymbolInfo value;
  SymbolKey key;
  size_t referenceIndex_local;
  int section_local;
  int file_local;
  Identifier *name_local;
  SymbolTable *this_local;
  
  referenceIndex_local._0_4_ = section;
  referenceIndex_local._4_4_ = file;
  _section_local = name;
  name_local = (Identifier *)this;
  bVar1 = isValidSymbolName(name);
  if (bVar1) {
    bVar1 = symbolExists(this,_section_local,referenceIndex_local._4_4_,(int)referenceIndex_local);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      setFileSectionValues
                (this,_section_local,(int *)((long)&referenceIndex_local + 4),
                 (int *)&referenceIndex_local);
      SymbolKey::SymbolKey
                ((SymbolKey *)&value.index,_section_local,referenceIndex_local._4_4_,
                 (int)referenceIndex_local);
      value._0_8_ = referenceIndex;
      pmVar2 = std::
               map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
               ::operator[](&this->symbols,(key_type *)&value.index);
      *(ulong *)pmVar2 = CONCAT44(uStack_64,1);
      pmVar2->index = value._0_8_;
      this->equationsCount = this->equationsCount + 1;
      this_local._7_1_ = 1;
      SymbolKey::~SymbolKey((SymbolKey *)&value.index);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SymbolTable::addEquation(const Identifier& name, int file, int section, size_t referenceIndex)
{
	if (!isValidSymbolName(name))
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, referenceIndex };
	symbols[key] = value;

	equationsCount++;
	return true;
}